

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,uint8 *indices)

{
  bool bVar1;
  Data *this_00;
  undefined1 local_36 [8];
  OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((((DAT_015b5fbd == '\0') && (layout.INDICES._8_2_ = SUB42(R0,0), R0 < 0x10000)) &&
      (layout.INDICES._10_2_ = SUB42(R1,0), R1 < 0x10000)) &&
     (layout.INDICES._12_2_ = SUB42(R2,0), R2 < 0x10000)) {
    memcpy_s(local_36,0x10,indices,0x10);
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>(this_00,op,&this->super_ByteCodeWriter,false);
    ByteCodeWriter::Data::Write(this_00,local_36,0x16);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmShuffle(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, uint8 indices[])
    {
        OpLayoutT_AsmShuffle<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2))
        {
            memcpy_s(layout.INDICES, Wasm::Simd::MAX_LANES, indices, Wasm::Simd::MAX_LANES);
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }